

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::Simulate(Model *this,int time_limit,double time_step,string *output)

{
  double dVar1;
  SpeciesTracker *this_00;
  ostream *this_01;
  char *__timer;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double time_stamp;
  string local_268;
  double local_248;
  double out_time;
  ostream local_230 [8];
  ofstream countfile;
  SpeciesTracker *tracker;
  string *output_local;
  double time_step_local;
  int time_limit_local;
  Model *this_local;
  
  this_00 = SpeciesTracker::Instance();
  Initialize(this);
  std::ofstream::ofstream(local_230,(string *)output,_S_trunc);
  __timer = "time\tspecies\tprotein\ttranscript\tribo_density\n";
  std::operator<<(local_230,"time\tspecies\tprotein\ttranscript\tribo_density\n");
  local_248 = 0.0;
  while( true ) {
    Gillespie::time(&this->gillespie_,(time_t *)__timer);
    dVar1 = local_248;
    if ((double)time_limit <= extraout_XMM0_Qa) break;
    Gillespie::time(&this->gillespie_,(time_t *)__timer);
    if (dVar1 - extraout_XMM0_Qa_00 < 0.001) {
      Gillespie::time(&this->gillespie_,(time_t *)__timer);
      SpeciesTracker::GatherCounts_abi_cxx11_(&local_268,this_00,time_stamp);
      __timer = (char *)&local_268;
      std::operator<<(local_230,(string *)__timer);
      std::__cxx11::string::~string((string *)&local_268);
      std::ostream::flush();
      local_248 = time_step + local_248;
    }
    Gillespie::Iterate(&this->gillespie_);
  }
  std::ofstream::close();
  this_01 = std::operator<<((ostream *)&std::cout,
                            "Simulation successful. Ignore any warnings that follow.");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_230);
  return;
}

Assistant:

void Model::Simulate(int time_limit, double time_step,
                     const std::string &output = "counts.tsv") {
  auto &tracker = SpeciesTracker::Instance();
  Initialize();
  // Set up file output streams
  std::ofstream countfile(output, std::ios::trunc);
  // Output header
  countfile << "time\tspecies\tprotein\ttranscript\tribo_density\n";
  double out_time = 0.0;
  while (gillespie_.time() < time_limit) {
    if ((out_time - gillespie_.time()) < 0.001) {
      countfile << tracker.GatherCounts(gillespie_.time());
      countfile.flush();
      out_time += time_step;
    }
    gillespie_.Iterate();
  }
  countfile.close();
  std::cout << "Simulation successful. Ignore any warnings that follow." << std::endl;
}